

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int estimated_pref_error(MV *this_mv,SUBPEL_SEARCH_VAR_PARAMS *var_params,uint *sse)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint8_t *puVar11;
  undefined8 in_RDX;
  long *in_RSI;
  MV *in_RDI;
  int subpel_y_q3;
  int subpel_x_q3;
  int invert_mask;
  int mask_stride;
  uint8_t *mask;
  uint8_t *second_pred;
  int ref_stride;
  int src_stride;
  uint8_t *ref;
  uint8_t *src;
  MSBuffers *ms_buffers;
  aom_variance_fn_ptr_t *vfp;
  int local_1c;
  
  lVar4 = *in_RSI;
  uVar5 = *(undefined8 *)in_RSI[3];
  puVar11 = get_buf_from_mv((buf_2d *)in_RSI[2],*in_RDI);
  uVar1 = *(undefined4 *)(in_RSI[3] + 0x18);
  uVar2 = *(undefined4 *)(in_RSI[2] + 0x18);
  lVar6 = in_RSI[4];
  lVar7 = in_RSI[5];
  lVar8 = in_RSI[6];
  uVar3 = *(undefined4 *)((long)in_RSI + 0x34);
  iVar9 = get_subpel_part((int)in_RDI->col);
  iVar10 = get_subpel_part((int)in_RDI->row);
  if (lVar6 == 0) {
    local_1c = (**(code **)(lVar4 + 0x20))(puVar11,uVar2,iVar9,iVar10,uVar5,uVar1,in_RDX);
  }
  else if (lVar7 == 0) {
    local_1c = (**(code **)(lVar4 + 0x28))(puVar11,uVar2,iVar9,iVar10,uVar5,uVar1,in_RDX,lVar6);
  }
  else {
    local_1c = (**(code **)(lVar4 + 0x50))
                         (puVar11,uVar2,iVar9,iVar10,uVar5,uVar1,lVar6,lVar7,(int)lVar8,uVar3,in_RDX
                         );
  }
  return local_1c;
}

Assistant:

static inline int estimated_pref_error(
    const MV *this_mv, const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    unsigned int *sse) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const uint8_t *src = ms_buffers->src->buf;
  const uint8_t *ref = get_buf_from_mv(ms_buffers->ref, *this_mv);
  const int src_stride = ms_buffers->src->stride;
  const int ref_stride = ms_buffers->ref->stride;
  const uint8_t *second_pred = ms_buffers->second_pred;
  const uint8_t *mask = ms_buffers->mask;
  const int mask_stride = ms_buffers->mask_stride;
  const int invert_mask = ms_buffers->inv_mask;

  const int subpel_x_q3 = get_subpel_part(this_mv->col);
  const int subpel_y_q3 = get_subpel_part(this_mv->row);

  if (second_pred == NULL) {
    return vfp->svf(ref, ref_stride, subpel_x_q3, subpel_y_q3, src, src_stride,
                    sse);
  } else if (mask) {
    return vfp->msvf(ref, ref_stride, subpel_x_q3, subpel_y_q3, src, src_stride,
                     second_pred, mask, mask_stride, invert_mask, sse);
  } else {
    return vfp->svaf(ref, ref_stride, subpel_x_q3, subpel_y_q3, src, src_stride,
                     sse, second_pred);
  }
}